

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.hpp
# Opt level: O3

void __thiscall vkt::synchronization::Buffer::~Buffer(Buffer *this)

{
  Allocation *pAVar1;
  VkBuffer obj;
  
  pAVar1 = (this->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  obj.m_internal =
       (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj);
  }
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  return;
}

Assistant:

Buffer			(const vk::DeviceInterface&		vk,
														 const vk::VkDevice				device,
														 vk::Allocator&					allocator,
														 const vk::VkBufferCreateInfo&	bufferCreateInfo,
														 const vk::MemoryRequirement	memoryRequirement)

											: m_buffer		(createBuffer(vk, device, &bufferCreateInfo))
											, m_allocation	(allocator.allocate(getBufferMemoryRequirements(vk, device, *m_buffer), memoryRequirement))
										{
											VK_CHECK(vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset()));
										}